

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corr.cpp
# Opt level: O1

AggregateFunction * duckdb::CorrFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  LogicalType *in_R8;
  LogicalType local_50 [24];
  LogicalType local_38 [24];
  
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffe0,DOUBLE);
  duckdb::LogicalType::LogicalType(local_38,DOUBLE);
  duckdb::LogicalType::LogicalType(local_50,DOUBLE);
  AggregateFunction::
  BinaryAggregate<duckdb::CorrState,double,double,double,duckdb::CorrOperation,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffe0,local_38,local_50,in_R8);
  duckdb::LogicalType::~LogicalType(local_50);
  duckdb::LogicalType::~LogicalType(local_38);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffe0);
  return in_RDI;
}

Assistant:

AggregateFunction CorrFun::GetFunction() {
	return AggregateFunction::BinaryAggregate<CorrState, double, double, double, CorrOperation>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::DOUBLE);
}